

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

void Gia_ManOrigIdsRemap(Gia_Man_t *p,Gia_Man_t *pNew)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int Entry;
  Gia_Obj_t *pGVar3;
  int iVar4;
  
  if (p->vIdsOrig != (Vec_Int_t *)0x0) {
    Gia_ManOrigIdsStart(pNew);
    Vec_IntWriteEntry(pNew->vIdsOrig,0,0);
    iVar4 = 1;
    while ((iVar4 < p->nObjs && (pGVar3 = Gia_ManObj(p,iVar4), pGVar3 != (Gia_Obj_t *)0x0))) {
      if ((pGVar3->Value != 0xffffffff) &&
         ((iVar2 = Abc_Lit2Var(pGVar3->Value), iVar2 != 0 &&
          (iVar2 = Vec_IntEntry(p->vIdsOrig,iVar4), iVar2 != -1)))) {
        pVVar1 = pNew->vIdsOrig;
        iVar2 = Abc_Lit2Var(pGVar3->Value);
        iVar2 = Vec_IntEntry(pVVar1,iVar2);
        if (iVar2 == -1) {
          pVVar1 = pNew->vIdsOrig;
          iVar2 = Abc_Lit2Var(pGVar3->Value);
          Entry = Vec_IntEntry(p->vIdsOrig,iVar4);
          Vec_IntWriteEntry(pVVar1,iVar2,Entry);
        }
      }
      iVar4 = iVar4 + 1;
    }
    iVar4 = 0;
    while (iVar4 < pNew->nObjs) {
      pGVar3 = Gia_ManObj(pNew,iVar4);
      if (pGVar3 == (Gia_Obj_t *)0x0) {
        return;
      }
      iVar2 = Vec_IntEntry(pNew->vIdsOrig,iVar4);
      iVar4 = iVar4 + 1;
      if (iVar2 < 0) {
        __assert_fail("Vec_IntEntry(pNew->vIdsOrig, i) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                      ,0x43,"void Gia_ManOrigIdsRemap(Gia_Man_t *, Gia_Man_t *)");
      }
    }
  }
  return;
}

Assistant:

void Gia_ManOrigIdsRemap( Gia_Man_t * p, Gia_Man_t * pNew )
{
    Gia_Obj_t * pObj; int i;
    if ( p->vIdsOrig == NULL )
        return;
    Gia_ManOrigIdsStart( pNew );
    Vec_IntWriteEntry( pNew->vIdsOrig, 0, 0 );
    Gia_ManForEachObj1( p, pObj, i )
        if ( ~pObj->Value && Abc_Lit2Var(pObj->Value) && Vec_IntEntry(p->vIdsOrig, i) != -1 && Vec_IntEntry(pNew->vIdsOrig, Abc_Lit2Var(pObj->Value)) == -1 )
            Vec_IntWriteEntry( pNew->vIdsOrig, Abc_Lit2Var(pObj->Value), Vec_IntEntry(p->vIdsOrig, i) );
    Gia_ManForEachObj( pNew, pObj, i )
        assert( Vec_IntEntry(pNew->vIdsOrig, i) >= 0 );
}